

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_misc.c
# Opt level: O3

int HTS_feof(HTS_File *fp)

{
  int iVar1;
  uint uVar2;
  
  uVar2 = 1;
  if (fp != (HTS_File *)0x0) {
    if (fp->type == '\x01') {
      uVar2 = (uint)(*(ulong *)((long)fp->pointer + 8) <= *(ulong *)((long)fp->pointer + 0x10));
    }
    else {
      if (fp->type == '\0') {
        iVar1 = feof((FILE *)fp->pointer);
        return iVar1;
      }
      HTS_feof_cold_1();
    }
  }
  return uVar2;
}

Assistant:

int HTS_feof(HTS_File * fp)
{
   if (fp == NULL) {
      return 1;
   } else if (fp->type == HTS_FILE) {
      return feof((FILE *) fp->pointer);
   } else if (fp->type == HTS_DATA) {
      HTS_Data *d = (HTS_Data *) fp->pointer;
      return d->size <= d->index ? 1 : 0;
   }
   HTS_error(0, "HTS_feof: Unknown file type.\n");
   return 1;
}